

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrEnumerateEnvironmentDepthSwapchainImagesMETA
                   (XrEnvironmentDepthSwapchainMETA swapchain,uint32_t imageCapacityInput,
                   uint32_t *imageCountOutput,XrSwapchainImageBaseHeader *images)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  ulong uVar3;
  XrSwapchainImageOpenGLKHR *value;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrEnvironmentDepthSwapchainMETA_T *in_stack_fffffffffffffd48;
  allocator local_2aa;
  allocator local_2a9;
  string local_2a8;
  GenValidUsageXrInstanceInfo *local_288;
  string local_280;
  XrEnvironmentDepthSwapchainMETA swapchain_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_220;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_208;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9f3ab9;
  swapchain_local = swapchain;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrEnvironmentDepthSwapchainMETA_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&swapchain_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrEnvironmentDepthSwapchainMETAHandle(&swapchain_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrEnvironmentDepthSwapchainMETA_T_*>::getWithInstanceInfo
                      (&g_environmentdepthswapchainmeta_info,swapchain_local);
    local_288 = pVar4.second;
    if (images == (XrSwapchainImageBaseHeader *)0x0 && imageCapacityInput != 0) {
      std::__cxx11::string::string
                ((string *)&oss,
                 "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                 (allocator *)&local_240);
      std::__cxx11::string::string
                ((string *)&local_2a8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_2aa);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_280,
                 "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is NULL, but imageCapacityInput is greater than 0"
                 ,&local_2a9);
      CoreValidLogMessage(local_288,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      this = &local_1d8;
    }
    else {
      if (imageCountOutput != (uint32_t *)0x0) {
        if (images != (XrSwapchainImageBaseHeader *)0x0) {
          value = (XrSwapchainImageOpenGLKHR *)images;
          for (uVar3 = 0; imageCapacityInput != uVar3; uVar3 = uVar3 + 1) {
            if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
              std::__cxx11::string::string
                        ((string *)&oss,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                         (allocator *)&local_2a8);
              XVar2 = ValidateXrStruct(local_288,(string *)&oss,&objects_info,false,true,value);
              std::__cxx11::string::~string((string *)&oss);
              if (XVar2 != XR_SUCCESS) {
                std::__cxx11::string::string
                          ((string *)&oss,
                           "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images",
                           (allocator *)&local_2a8);
                std::__cxx11::string::append((char *)&oss);
                std::__cxx11::to_string(&local_2a8,(uint)uVar3);
                std::__cxx11::string::append((string *)&oss);
                std::__cxx11::string::~string((string *)&local_2a8);
                std::__cxx11::string::append((char *)&oss);
                std::__cxx11::string::append((char *)&oss);
                std::__cxx11::string::string
                          ((string *)&local_2a8,
                           "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                           (allocator *)&local_240);
                std::__cxx11::string::string
                          ((string *)&local_280,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                           &local_2aa);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)&local_208,&objects_info);
                CoreValidLogMessage(local_288,&local_2a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280
                                    ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      *)&local_208,(string *)&oss);
                std::
                _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                ::~_Vector_base(&local_208);
                std::__cxx11::string::~string((string *)&local_280);
                goto LAB_00207905;
              }
            }
            else {
              std::__cxx11::string::string
                        ((string *)&oss,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                         (allocator *)&local_2a8);
              XVar2 = ValidateXrStruct(local_288,(string *)&oss,&objects_info,true,false,images);
              std::__cxx11::string::~string((string *)&oss);
              if (XVar2 != XR_SUCCESS) {
                std::__cxx11::string::string
                          ((string *)&oss,
                           "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                           (allocator *)&local_240);
                std::__cxx11::string::string
                          ((string *)&local_2a8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                           &local_2aa);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)&local_220,&objects_info);
                std::__cxx11::string::string
                          ((string *)&local_280,
                           "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is invalid"
                           ,&local_2a9);
                CoreValidLogMessage(local_288,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                    &local_2a8,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)&local_220,&local_280);
                std::__cxx11::string::~string((string *)&local_280);
                this = &local_220;
                goto LAB_00207900;
              }
            }
            value = value + 1;
            images = images + 1;
          }
        }
        XVar2 = XR_SUCCESS;
        goto LAB_0020791f;
      }
      std::__cxx11::string::string
                ((string *)&oss,
                 "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter",
                 (allocator *)&local_240);
      std::__cxx11::string::string
                ((string *)&local_2a8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_2aa);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1f0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_280,
                 "Invalid NULL for uint32_t \"imageCountOutput\" which is not optional and must be non-NULL"
                 ,&local_2a9);
      CoreValidLogMessage(local_288,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2a8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1f0,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      this = &local_1f0;
    }
LAB_00207900:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
LAB_00207905:
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrEnvironmentDepthSwapchainMETA handle \"swapchain\" ")
    ;
    HandleToHexString<XrEnvironmentDepthSwapchainMETA_T*>(in_stack_fffffffffffffd48);
    std::operator<<((ostream *)&oss,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::string
              ((string *)&local_2a8,
               "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-swapchain-parameter",&local_2aa)
    ;
    std::__cxx11::string::string
              ((string *)&local_280,"xrEnumerateEnvironmentDepthSwapchainImagesMETA",&local_2a9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2a8,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_280,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c0,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1c0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_0020791f:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateEnvironmentDepthSwapchainImagesMETA(
XrEnvironmentDepthSwapchainMETA swapchain,
uint32_t imageCapacityInput,
uint32_t* imageCountOutput,
XrSwapchainImageBaseHeader* images) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(swapchain, XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrEnvironmentDepthSwapchainMETAHandle(&swapchain);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrEnvironmentDepthSwapchainMETA handle \"swapchain\" ";
                oss << HandleToHexString(swapchain);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-swapchain-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_environmentdepthswapchainmeta_info.getWithInstanceInfo(swapchain);
        GenValidUsageXrHandleInfo *gen_environmentdepthswapchainmeta_info = info_with_instance.first;
        (void)gen_environmentdepthswapchainmeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Optional array must be non-NULL when imageCapacityInput is non-zero
        if (0 != imageCapacityInput && nullptr == images) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                objects_info,
                                "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is NULL, but imageCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == imageCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA", objects_info,
                                "Invalid NULL for uint32_t \"imageCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter" type
        if (images) {
            for (uint32_t value_images_inc = 0; value_images_inc < imageCapacityInput; ++value_images_inc) {
#if defined(XR_USE_GRAPHICS_API_OPENGL)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageOpenGLKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageOpenGLKHR* new_swapchainimageopenglkhr_value = reinterpret_cast<XrSwapchainImageOpenGLKHR*>(images);
                        if (new_swapchainimageopenglkhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
                            if (nullptr != new_swapchainimageopenglkhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimageopenglkhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL)
#if defined(XR_USE_GRAPHICS_API_OPENGL_ES)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageOpenGLESKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageOpenGLESKHR* new_swapchainimageopengleskhr_value = reinterpret_cast<XrSwapchainImageOpenGLESKHR*>(images);
                        if (new_swapchainimageopengleskhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_ES_KHR) {
                            if (nullptr != new_swapchainimageopengleskhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimageopengleskhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL_ES)
#if defined(XR_USE_GRAPHICS_API_VULKAN)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageVulkanKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageVulkanKHR* new_swapchainimagevulkankhr_value = reinterpret_cast<XrSwapchainImageVulkanKHR*>(images);
                        if (new_swapchainimagevulkankhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_VULKAN_KHR) {
                            if (nullptr != new_swapchainimagevulkankhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimagevulkankhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_VULKAN)
#if defined(XR_USE_GRAPHICS_API_D3D11)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageD3D11KHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageD3D11KHR* new_swapchainimaged3d11khr_value = reinterpret_cast<XrSwapchainImageD3D11KHR*>(images);
                        if (new_swapchainimaged3d11khr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_D3D11_KHR) {
                            if (nullptr != new_swapchainimaged3d11khr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimaged3d11khr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_D3D11)
#if defined(XR_USE_GRAPHICS_API_D3D12)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageD3D12KHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageD3D12KHR* new_swapchainimaged3d12khr_value = reinterpret_cast<XrSwapchainImageD3D12KHR*>(images);
                        if (new_swapchainimaged3d12khr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_D3D12_KHR) {
                            if (nullptr != new_swapchainimaged3d12khr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimaged3d12khr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_D3D12)
                // Validate that the base-structure XrSwapchainImageBaseHeader is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA", objects_info,
                                                                true, true, &images[value_images_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                        objects_info,
                                        "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}